

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O3

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::GoogleOnceDynamic*,std::allocator<google::protobuf::GoogleOnceDynamic*>>>
               (vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
                *container)

{
  pointer ppGVar1;
  GoogleOnceDynamic *pGVar2;
  pointer ppGVar3;
  
  if (container !=
      (vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
       *)0x0) {
    ppGVar3 = (container->
              super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppGVar1 = (container->
              super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppGVar3 != ppGVar1) {
      do {
        pGVar2 = *ppGVar3;
        ppGVar3 = ppGVar3 + 1;
        operator_delete(pGVar2,8);
      } while (ppGVar3 != ppGVar1);
      ppGVar3 = (container->
                super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((container->
          super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppGVar3) {
        (container->
        super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = ppGVar3;
      }
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}